

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::addQualifierToExisting
          (TParseContext *this,TSourceLoc *loc,TQualifier qualifier,TString *identifier)

{
  bool bVar1;
  int iVar2;
  TSymbol *shared;
  undefined4 extraout_var;
  TVariable *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TQualifier *qualifier_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar3;
  undefined4 extraout_var_04;
  pointer pcVar4;
  char *pcVar5;
  ulong uVar6;
  size_t s;
  _func_int **pp_Var7;
  _func_int *UNRECOVERED_JUMPTABLE;
  TTypeList typeList;
  TType blockNameType;
  TType blockType;
  
  shared = TSymbolTable::find((this->super_TParseContextBase).symbolTable,identifier,(bool *)0x0,
                              (bool *)0x0,(int *)0x0);
  if (shared == (TSymbol *)0x0) {
    if (qualifier.layoutBufferReference != true) {
      pcVar4 = (identifier->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar5 = "identifier not previously declared";
      goto LAB_003b154f;
    }
    if ((~qualifier._36_8_ & 0x1f8000000000000) != 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                (this,loc,
                 "the buffer_reference_align layout is ignored when defined in forward declaration",
                 (identifier->_M_dataplus)._M_p,"");
    }
    if ((qualifier._16_1_ & 0xf) != 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                (this,loc,
                 "the packing layout (scalar, std430, etc) is ignored when defined in forward declaration"
                 ,(identifier->_M_dataplus)._M_p,"");
    }
    TVector<glslang::TTypeLoc>::TVector(&typeList);
    TType::TType(&blockType,&typeList,identifier,&qualifier);
    s = 0x12;
    TType::TType(&blockNameType,EbtReference,&blockType,identifier);
    this_00 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,s);
    TVariable::TVariable(this_00,identifier,&blockNameType,true);
    bVar1 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_00);
    if (bVar1) {
      return;
    }
    pcVar4 = (this->blockName->_M_dataplus)._M_p;
    pp_Var7 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar5 = "block name cannot redefine a non-block name";
  }
  else {
    iVar2 = (*shared->_vptr_TSymbol[7])(shared);
    if (CONCAT44(extraout_var,iVar2) != 0) {
      pcVar4 = (identifier->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar5 = "cannot re-qualify a function name";
LAB_003b154f:
      (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar5,pcVar4,"",UNRECOVERED_JUMPTABLE);
      return;
    }
    if ((((CONCAT44(qualifier._12_4_,qualifier._8_4_) & 0x3fff1e0e0000000) == 0) &&
        (bVar1 = TQualifier::hasLayout(&qualifier), !bVar1)) && ((qualifier._8_4_ & 0xe00007f) == 0)
       ) {
      iVar2 = (*shared->_vptr_TSymbol[0x14])(shared);
      if ((char)iVar2 != '\0') {
        shared = TSymbolTable::copyUp((this->super_TParseContextBase).symbolTable,shared);
      }
      if (((uint)qualifier._8_4_ >> 0x1c & 1) != 0) {
        bVar1 = TIntermediate::inIoAccessed
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           identifier);
        if (bVar1) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot change qualification after use","invariant","");
        }
        iVar2 = (*shared->_vptr_TSymbol[0xd])(shared);
        lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x50))
                          ((long *)CONCAT44(extraout_var_00,iVar2));
        *(byte *)(lVar3 + 0xb) = *(byte *)(lVar3 + 0xb) | 0x10;
        iVar2 = (*shared->_vptr_TSymbol[0xc])(shared);
        qualifier_00 = (TQualifier *)
                       (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x58))
                                 ((long *)CONCAT44(extraout_var_01,iVar2));
        invariantCheck(this,loc,qualifier_00);
        return;
      }
      if ((qualifier._12_4_ & 0x10) != 0) {
        bVar1 = TIntermediate::inIoAccessed
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           identifier);
        if (bVar1) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot change qualification after use","precise","");
        }
        iVar2 = (*shared->_vptr_TSymbol[0xd])(shared);
        lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x50))
                          ((long *)CONCAT44(extraout_var_02,iVar2));
        *(ulong *)(lVar3 + 8) = *(ulong *)(lVar3 + 8) | 0x1000000000;
        return;
      }
      if ((qualifier._12_4_ & 1) == 0) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                  (this,loc,"unknown requalification","","");
        return;
      }
      iVar2 = (*shared->_vptr_TSymbol[0xd])(shared);
      lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0x50))
                        ((long *)CONCAT44(extraout_var_03,iVar2));
      *(ulong *)(lVar3 + 8) = (*(ulong *)(lVar3 + 8) & 0xfffffffeffffff80) + 0x100000002;
      uVar6 = qualifier._36_8_ & 0x7ff0000000000;
      if (uVar6 == 0x7ff0000000000) {
        return;
      }
      iVar2 = (*shared->_vptr_TSymbol[0xd])(shared);
      lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0x50))
                        ((long *)CONCAT44(extraout_var_04,iVar2));
      *(ulong *)(lVar3 + 0x24) = *(ulong *)(lVar3 + 0x24) & 0xfff800ffffffffff | uVar6;
      return;
    }
    pcVar4 = (identifier->_M_dataplus)._M_p;
    pp_Var7 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar5 = 
    "cannot add storage, auxiliary, memory, interpolation, layout, or precision qualifier to an existing variable"
    ;
  }
  (*pp_Var7[0x2d])(this,loc,pcVar5,pcVar4,"");
  return;
}

Assistant:

void TParseContext::addQualifierToExisting(const TSourceLoc& loc, TQualifier qualifier, const TString& identifier)
{
    TSymbol* symbol = symbolTable.find(identifier);

    // A forward declaration of a block reference looks to the grammar like adding
    // a qualifier to an existing symbol. Detect this and create the block reference
    // type with an empty type list, which will be filled in later in
    // TParseContext::declareBlock.
    if (!symbol && qualifier.hasBufferReference()) {
        // The layout qualifiers are ignored in forward declaration, give warning for the most probable to be seen
        if (qualifier.hasBufferReferenceAlign()) {
            warn(loc, "the buffer_reference_align layout is ignored when defined in forward declaration",
                 identifier.c_str(), "");
        }
        if (qualifier.hasPacking()) {
            warn(loc, "the packing layout (scalar, std430, etc) is ignored when defined in forward declaration",
                 identifier.c_str(), "");
        }
        TTypeList typeList;
        TType blockType(&typeList, identifier, qualifier);
        TType blockNameType(EbtReference, blockType, identifier);
        TVariable* blockNameVar = new TVariable(&identifier, blockNameType, true);
        if (! symbolTable.insert(*blockNameVar)) {
            error(loc, "block name cannot redefine a non-block name", blockName->c_str(), "");
        }
        return;
    }

    if (! symbol) {
        error(loc, "identifier not previously declared", identifier.c_str(), "");
        return;
    }
    if (symbol->getAsFunction()) {
        error(loc, "cannot re-qualify a function name", identifier.c_str(), "");
        return;
    }

    if (qualifier.isAuxiliary() ||
        qualifier.isMemory() ||
        qualifier.isInterpolation() ||
        qualifier.hasLayout() ||
        qualifier.storage != EvqTemporary ||
        qualifier.precision != EpqNone) {
        error(loc, "cannot add storage, auxiliary, memory, interpolation, layout, or precision qualifier to an existing variable", identifier.c_str(), "");
        return;
    }

    // For read-only built-ins, add a new symbol for holding the modified qualifier.
    // This will bring up an entire block, if a block type has to be modified (e.g., gl_Position inside a block)
    if (symbol->isReadOnly())
        symbol = symbolTable.copyUp(symbol);

    if (qualifier.invariant) {
        if (intermediate.inIoAccessed(identifier))
            error(loc, "cannot change qualification after use", "invariant", "");
        symbol->getWritableType().getQualifier().invariant = true;
        invariantCheck(loc, symbol->getType().getQualifier());
    } else if (qualifier.isNoContraction()) {
        if (intermediate.inIoAccessed(identifier))
            error(loc, "cannot change qualification after use", "precise", "");
        symbol->getWritableType().getQualifier().setNoContraction();
    } else if (qualifier.specConstant) {
        symbol->getWritableType().getQualifier().makeSpecConstant();
        if (qualifier.hasSpecConstantId())
            symbol->getWritableType().getQualifier().layoutSpecConstantId = qualifier.layoutSpecConstantId;
    } else
        warn(loc, "unknown requalification", "", "");
}